

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O0

void __thiscall Nova::Simplex_Mesh<3>::Initialize_Adjacent_Elements(Simplex_Mesh<3> *this)

{
  INDEX *pIVar1;
  int simplex;
  Array<Nova::Array<int>_> *pAVar2;
  size_t m;
  INDEX *pIVar3;
  Vector<int,_3,_true> local_5c;
  Vector<int,_3,_true> *pVStack_50;
  int i;
  INDEX *element;
  size_t t;
  undefined1 local_38 [2];
  bool incident_elements_defined;
  Simplex_Mesh<3> *local_10;
  Simplex_Mesh<3> *this_local;
  
  local_10 = this;
  if ((this->adjacent_elements != (Array<Nova::Array<int>_> *)0x0) &&
     (pAVar2 = this->adjacent_elements, pAVar2 != (Array<Nova::Array<int>_> *)0x0)) {
    Array<Nova::Array<int>_>::~Array(pAVar2);
    operator_delete(pAVar2);
  }
  pAVar2 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  t._3_1_ = 1;
  m = Array<Nova::Vector<int,_3,_true>_>::size(&this->elements);
  t._4_4_ = 0;
  Array<int>::Array((Array<int> *)local_38,0,(int *)((long)&t + 4));
  Array<Nova::Array<int>_>::Array(pAVar2,m,(Array<int> *)local_38);
  t._3_1_ = 0;
  this->adjacent_elements = pAVar2;
  Array<int>::~Array((Array<int> *)local_38);
  t._2_1_ = this->incident_elements != (Array<Nova::Array<int>_> *)0x0;
  if (!(bool)t._2_1_) {
    Initialize_Incident_Elements(this);
  }
  for (element = (INDEX *)0x0; pIVar1 = element,
      pIVar3 = (INDEX *)Array<Nova::Vector<int,_3,_true>_>::size(&this->elements), pIVar1 < pIVar3;
      element = (INDEX *)((long)(element->_data)._M_elems + 1)) {
    pVStack_50 = Array<Nova::Vector<int,_3,_true>_>::operator()(&this->elements,(int)element);
    for (local_5c._data._M_elems[2] = 0; local_5c._data._M_elems[2] < 3;
        local_5c._data._M_elems[2] = local_5c._data._M_elems[2] + 1) {
      simplex = (int)element;
      Vector<int,_3,_true>::Remove_Index(&local_5c,(int)pVStack_50);
      Find_And_Append_Adjacent_Elements(this,simplex,(Vector<int,_2,_true> *)&local_5c);
    }
  }
  if ((t._2_1_ & 1) == 0) {
    pAVar2 = this->incident_elements;
    if (pAVar2 != (Array<Nova::Array<int>_> *)0x0) {
      Array<Nova::Array<int>_>::~Array(pAVar2);
      operator_delete(pAVar2);
    }
    this->incident_elements = (Array<Nova::Array<int>_> *)0x0;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Adjacent_Elements()
{
    if(adjacent_elements!=nullptr) delete adjacent_elements;
    adjacent_elements=new Array<Array<int>>(elements.size());
    
    bool incident_elements_defined=(incident_elements!=nullptr);
    if(!incident_elements_defined) Initialize_Incident_Elements();

    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) Find_And_Append_Adjacent_Elements(t,element.Remove_Index(i));}
    if(!incident_elements_defined){delete incident_elements;incident_elements=nullptr;}
}